

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::SortImages(CEditor *this)

{
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *other;
  CEditorImage **ppCVar1;
  int *piVar2;
  bool bVar3;
  int OldIndex;
  ulong uVar4;
  int NewIndex;
  long lVar5;
  int i;
  long lVar6;
  long in_FS_OFFSET;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  other = &(this->m_Map).m_lImages;
  lVar6 = 1;
  do {
    if ((this->m_Map).m_lImages.num_elements <= lVar6) goto LAB_00186b0d;
    bVar3 = CEditorImage::operator<(other->list[lVar6],other->list[lVar6 + -1]);
    lVar6 = lVar6 + 1;
  } while (!bVar3);
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::array(&local_30,other);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)local_30.num_elements) {
    uVar4 = (long)local_30.num_elements * 4;
  }
  gs_pSortedIndex = (int *)operator_new__(uVar4);
  ppCVar1 = (this->m_Map).m_lImages.list;
  std::
  __stable_sort<CEditorImage**,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(CEditorImage_const*,CEditorImage_const*)>>
            (ppCVar1,ppCVar1 + (this->m_Map).m_lImages.num_elements,
             (_Iter_comp_iter<int_(*)(const_CEditorImage_*,_const_CEditorImage_*)>)0x18c237);
  piVar2 = gs_pSortedIndex;
  for (lVar6 = 0; lVar6 < local_30.num_elements; lVar6 = lVar6 + 1) {
    ppCVar1 = other->list;
    for (lVar5 = 0; lVar5 < (this->m_Map).m_lImages.num_elements; lVar5 = lVar5 + 1) {
      if (local_30.list[lVar6] == ppCVar1[lVar5]) {
        piVar2[lVar6] = (int)lVar5;
      }
    }
  }
  CEditorMap::ModifyImageIndex(&this->m_Map,ModifySortedIndex);
  if (gs_pSortedIndex != (int *)0x0) {
    operator_delete__(gs_pSortedIndex);
  }
  gs_pSortedIndex = (int *)0x0;
  allocator_default<CEditorImage_*>::free_array(local_30.list);
LAB_00186b0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::SortImages()
{
	bool Sorted = true;
	for(int i = 1; i < m_Map.m_lImages.size(); i++)
		if(*m_Map.m_lImages[i] < *m_Map.m_lImages[i-1])
		{
			Sorted = false;
			break;
		}

	if(!Sorted)
	{
		array<CEditorImage*> lTemp = array<CEditorImage*>(m_Map.m_lImages);
		gs_pSortedIndex = new int[lTemp.size()];

		std::stable_sort(&m_Map.m_lImages[0], &m_Map.m_lImages[m_Map.m_lImages.size()], CompareImage);

		for(int OldIndex = 0; OldIndex < lTemp.size(); OldIndex++)
			for(int NewIndex = 0; NewIndex < m_Map.m_lImages.size(); NewIndex++)
				if(lTemp[OldIndex] == m_Map.m_lImages[NewIndex])
					gs_pSortedIndex[OldIndex] = NewIndex;

		m_Map.ModifyImageIndex(ModifySortedIndex);

		delete [] gs_pSortedIndex;
		gs_pSortedIndex = 0;
	}
}